

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlRegAtomPtr xmlRegNewAtom(xmlRegParserCtxtPtr ctxt,xmlRegAtomType type)

{
  xmlRegAtomPtr pxVar1;
  
  pxVar1 = (xmlRegAtomPtr)(*xmlMalloc)(0x60);
  if (pxVar1 == (xmlRegAtomPtr)0x0) {
    ctxt->error = 2;
    pxVar1 = (xmlRegAtomPtr)0x0;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                        (xmlError *)0x0);
  }
  else {
    pxVar1->no = 0;
    pxVar1->type = 0;
    pxVar1->quant = 0;
    pxVar1->min = 0;
    *(undefined8 *)&pxVar1->max = 0;
    pxVar1->valuep = (void *)0x0;
    pxVar1->ranges = (xmlRegRangePtr *)0x0;
    pxVar1->data = (void *)0x0;
    pxVar1->stop = (xmlRegStatePtr)0x0;
    pxVar1->maxRanges = 0;
    pxVar1->nbRanges = 0;
    pxVar1->start = (xmlRegStatePtr)0x0;
    pxVar1->start0 = (xmlRegStatePtr)0x0;
    pxVar1->valuep2 = (void *)0x0;
    pxVar1->neg = 0;
    pxVar1->codepoint = 0;
    pxVar1->type = type;
    pxVar1->quant = XML_REGEXP_QUANT_ONCE;
    pxVar1->min = 0;
    pxVar1->max = 0;
  }
  return pxVar1;
}

Assistant:

static xmlRegAtomPtr
xmlRegNewAtom(xmlRegParserCtxtPtr ctxt, xmlRegAtomType type) {
    xmlRegAtomPtr ret;

    ret = (xmlRegAtomPtr) xmlMalloc(sizeof(xmlRegAtom));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegAtom));
    ret->type = type;
    ret->quant = XML_REGEXP_QUANT_ONCE;
    ret->min = 0;
    ret->max = 0;
    return(ret);
}